

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O3

void __thiscall GenericModelItem::insertColumns(GenericModelItem *this,int column,int count)

{
  int iVar1;
  GenericModelItem **ppGVar2;
  GenericModelItem *pGVar3;
  reference ppGVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong i;
  GenericModelItem *local_38;
  
  iVar1 = this->m_rowCount;
  if (0 < iVar1) {
    iVar8 = this->m_colCount;
    if (iVar8 == 0) {
      iVar1 = iVar1 * count;
      QList<GenericModelItem_*>::reserve(&this->children,(long)iVar1);
      if (0 < iVar1) {
        iVar8 = 0;
        do {
          local_38 = (GenericModelItem *)operator_new(0x58);
          local_38->_vptr_GenericModelItem = (_func_int **)&PTR__GenericModelItem_00166ae0;
          local_38->parent = this;
          (local_38->data).d.d =
               (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                *)0x0;
          local_38->flags = 0x2f;
          local_38->m_colCount = 0;
          local_38->m_rowCount = 0;
          local_38->m_rowSpan = 1;
          local_38->m_colSpan = 1;
          (local_38->children).d.d = (Data *)0x0;
          (local_38->children).d.ptr = (GenericModelItem **)0x0;
          (local_38->children).d.size = 0;
          local_38->m_model = this->m_model;
          local_38->m_column = iVar8 % count;
          local_38->m_row = iVar8 / count;
          QtPrivate::QPodArrayOps<GenericModelItem*>::emplace<GenericModelItem*&>
                    ((QPodArrayOps<GenericModelItem*> *)&this->children,(this->children).d.size,
                     &local_38);
          iVar8 = iVar8 + 1;
        } while (iVar1 != iVar8);
      }
    }
    else {
      uVar5 = (iVar1 + -1) * iVar8 + column;
      if (-1 < (int)uVar5) {
        do {
          iVar1 = (int)(uVar5 - column) / iVar8;
          if (-1 < iVar1) {
            iVar8 = iVar8 + (uVar5 - column);
            i = (ulong)uVar5;
            if ((int)uVar5 < iVar8) {
              ppGVar2 = (this->children).d.ptr + i;
              uVar6 = uVar5;
              do {
                (*ppGVar2)->m_column = (*ppGVar2)->m_column + count;
                ppGVar2 = ppGVar2 + 1;
                uVar6 = uVar6 + 1;
              } while ((int)uVar6 < iVar8);
            }
            if ((count != 0) &&
               (QtPrivate::QPodArrayOps<GenericModelItem_*>::insert
                          ((QPodArrayOps<GenericModelItem_*> *)&this->children,i,(long)count,
                           (parameter_type)0x0), uVar7 = (ulong)(uint)count, iVar8 = column,
               0 < count)) {
              do {
                pGVar3 = (GenericModelItem *)operator_new(0x58);
                pGVar3->_vptr_GenericModelItem = (_func_int **)&PTR__GenericModelItem_00166ae0;
                pGVar3->parent = this;
                (pGVar3->data).d.d =
                     (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                      *)0x0;
                pGVar3->flags = 0x2f;
                pGVar3->m_colCount = 0;
                pGVar3->m_rowCount = 0;
                pGVar3->m_rowSpan = 1;
                pGVar3->m_colSpan = 1;
                (pGVar3->children).d.d = (Data *)0x0;
                (pGVar3->children).d.ptr = (GenericModelItem **)0x0;
                (pGVar3->children).d.size = 0;
                pGVar3->m_model = this->m_model;
                pGVar3->m_column = iVar8;
                pGVar3->m_row = iVar1;
                ppGVar4 = QList<GenericModelItem_*>::operator[](&this->children,i);
                *ppGVar4 = pGVar3;
                i = i + 1;
                uVar7 = uVar7 - 1;
                iVar8 = iVar8 + 1;
              } while (uVar7 != 0);
            }
          }
          iVar8 = this->m_colCount;
          uVar5 = uVar5 - iVar8;
        } while (-1 < (int)uVar5);
      }
    }
  }
  this->m_colCount = this->m_colCount + count;
  return;
}

Assistant:

void GenericModelItem::insertColumns(int column, int count)
{
    if (m_rowCount > 0) {
        if (m_colCount == 0) {
            Q_ASSERT(column == 0);
            Q_ASSERT(children.isEmpty());
            const int childrenSize = count * m_rowCount;
            children.reserve(childrenSize);
            for (int j = 0; j < childrenSize; ++j) {
                auto newChild = new GenericModelItem(this);
                newChild->m_column = j % count;
                newChild->m_row = j / count;
                children.append(newChild);
            }
        } else {
            for (int i = column + (m_colCount * (m_rowCount - 1)); i >= 0; i -= m_colCount) {
                Q_ASSERT((i - column) % m_colCount == 0);
                const int rowIndex = (i - column) / m_colCount;
                if (rowIndex < 0)
                    continue;
                for (int j = i; j < i - column + m_colCount; ++j)
                    children.at(j)->m_column += count;
                children.insert(i, count, nullptr);
                for (int j = 0; j < count; ++j) {
                    auto newChild = new GenericModelItem(this);
                    newChild->m_column = column + j;
                    newChild->m_row = rowIndex;
                    children[i + j] = newChild;
                }
            }
        }
    }
    m_colCount += count;
#ifdef QT_DEBUG
    Q_ASSERT(m_colCount * m_rowCount == children.size());
    for (int i = 0; i < children.size(); ++i) {
        Q_ASSERT(children.at(i)->row() == i / m_colCount);
        Q_ASSERT(children.at(i)->column() == i % m_colCount);
    }
#endif
}